

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrEventDataColocationDiscoveryCompleteMETA *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  XrResult XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  PFN_xrResultToString p_Var6;
  XrStructureType __val;
  XrResult __val_00;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char *pcVar10;
  XrInstance pXVar11;
  invalid_argument *this;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  char cVar17;
  string out;
  string type_prefix;
  string next_prefix;
  string discoveryrequestid_prefix;
  string result_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_58;
  string local_50;
  
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_d8._M_dataplus._M_p = (pointer)value;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x12');
  *local_118._M_dataplus._M_p = '0';
  local_118._M_dataplus._M_p[1] = 'x';
  pcVar10 = local_118._M_dataplus._M_p + (local_118._M_string_length - 1);
  lVar13 = 0;
  do {
    bVar1 = *(byte *)((long)&local_d8._M_dataplus._M_p + lVar13);
    *pcVar10 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar10[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar13 = lVar13 + 1;
    pcVar10 = pcVar10 + -2;
  } while (lVar13 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_d8);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar2 = value->type;
    __val = -XVar2;
    if (0 < (int)XVar2) {
      __val = XVar2;
    }
    uVar16 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar15 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar16 = uVar7;
        uVar12 = (uint)uVar15;
        if (uVar12 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_00216f61;
        }
        if (uVar12 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_00216f61;
        }
        if (uVar12 < 10000) goto LAB_00216f61;
        uVar15 = uVar15 / 10000;
        uVar7 = uVar16 + 4;
      } while (99999 < uVar12);
      uVar16 = uVar16 + 1;
    }
LAB_00216f61:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_58 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents;
    std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar16 - (char)((int)XVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_118._M_dataplus._M_p + (XVar2 >> 0x1f),uVar16,__val);
    contents = (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_58;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              (local_58,(char (*) [16])"XrStructureType",&local_d8,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_118.field_2._M_allocated_capacity = 0;
    local_118.field_2._8_8_ = 0;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar11 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar11,value->type,(char *)&local_118);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_d8,(char (*) [64])&local_118);
  }
  local_b8 = local_a8;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_b8);
  value_00 = value->next;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_b8,local_b0 + (long)local_b8);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_50,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid Operation");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_98);
  uVar15 = value->discoveryRequestId;
  cVar17 = '\x01';
  if (9 < uVar15) {
    uVar14 = uVar15;
    cVar8 = '\x04';
    do {
      cVar17 = cVar8;
      if (uVar14 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_0021710f;
      }
      if (uVar14 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_0021710f;
      }
      if (uVar14 < 10000) goto LAB_0021710f;
      bVar9 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar8 = cVar17 + '\x04';
    } while (bVar9);
    cVar17 = cVar17 + '\x01';
  }
LAB_0021710f:
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_118,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_118._M_dataplus._M_p,(uint)local_118._M_string_length,uVar15);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [19])"XrAsyncRequestIdFB",&local_98,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->result;
    __val_00 = -XVar3;
    if (XR_SUCCESS < XVar3) {
      __val_00 = XVar3;
    }
    uVar16 = 1;
    if (9 < (uint)__val_00) {
      uVar15 = (ulong)(uint)__val_00;
      uVar7 = 4;
      do {
        uVar16 = uVar7;
        uVar12 = (uint)uVar15;
        if (uVar12 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_00217276;
        }
        if (uVar12 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_00217276;
        }
        if (uVar12 < 10000) goto LAB_00217276;
        uVar15 = uVar15 / 10000;
        uVar7 = uVar16 + 4;
      } while (99999 < uVar12);
      uVar16 = uVar16 + 1;
    }
LAB_00217276:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar16 - (char)(XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_118._M_dataplus._M_p + ((uint)XVar3 >> 0x1f),uVar16,__val_00);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"XrResult",&local_78,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_118.field_2._M_allocated_capacity = 0;
    local_118.field_2._8_8_ = 0;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_118._M_string_length = 0;
    p_Var6 = gen_dispatch_table->ResultToString;
    pXVar11 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar11,value->result,(char *)&local_118);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"XrResult",&local_78,(char (*) [64])&local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrEventDataColocationDiscoveryCompleteMETA* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string discoveryrequestid_prefix = prefix;
        discoveryrequestid_prefix += "discoveryRequestId";
        contents.emplace_back("XrAsyncRequestIdFB", discoveryrequestid_prefix, std::to_string(value->discoveryRequestId));
        std::string result_prefix = prefix;
        result_prefix += "result";
        if (nullptr != gen_dispatch_table) {
            char result_string[XR_MAX_RESULT_STRING_SIZE] = {};
            gen_dispatch_table->ResultToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                               value->result, result_string);
            contents.emplace_back("XrResult", result_prefix, result_string);
        } else {
                        contents.emplace_back("XrResult", result_prefix, std::to_string(value->result));
        }
        return true;
    } catch(...) {
    }
    return false;
}